

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

string * __thiscall
front::irGenerator::irGenerator::getStringName_abi_cxx11_(irGenerator *this,uint32_t id)

{
  string *in_RDI;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb0);
  std::__cxx11::to_string(in_stack_ffffffffffffffbc);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

string irGenerator::getStringName(uint32_t id) {
  return _StringNamePrefix + "_" + std::to_string(id);
}